

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

uchar * convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  byte bVar2;
  uchar uVar3;
  uchar *puVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  byte *pbVar10;
  ulong uVar11;
  byte *pbVar12;
  ulong uVar13;
  ulong uVar14;
  
  puVar4 = data;
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                    ,0x1dc,"unsigned char *convert_format(unsigned char *, int, int, uint, uint)");
    }
    puVar4 = (uchar *)malloc((ulong)(x * req_comp * y));
    if (puVar4 == (uchar *)0x0) {
      free(data);
      failure_reason = "Out of memory";
      puVar4 = (uchar *)0x0;
    }
    else {
      if (0 < (int)y) {
        uVar6 = req_comp + img_n * 8;
        if ((0x23 < uVar6) || ((0xe161a1c00U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                        ,0x1f9,
                        "unsigned char *convert_format(unsigned char *, int, int, uint, uint)");
        }
        iVar1 = x - 1;
        uVar5 = 1;
        if (1 < (int)y) {
          uVar5 = (ulong)y;
        }
        uVar13 = 0;
        uVar14 = 0;
        uVar11 = 0;
        do {
          iVar9 = (int)uVar11 * x;
          pbVar12 = data + (uint)(iVar9 * img_n);
          pbVar10 = puVar4 + (uint)(iVar9 * req_comp);
          if (uVar6 - 10 < 0x19) {
            switch(uVar6) {
            case 10:
              if (-1 < iVar1) {
                lVar8 = 0;
                uVar7 = x;
                do {
                  puVar4[lVar8 * 2 + uVar14] = data[lVar8 + uVar13];
                  puVar4[lVar8 * 2 + uVar14 + 1] = 0xff;
                  uVar7 = uVar7 - 1;
                  lVar8 = lVar8 + 1;
                } while (0 < (int)uVar7);
              }
              break;
            case 0xb:
              if (-1 < iVar1) {
                pbVar10 = puVar4 + uVar14 + 2;
                uVar7 = x;
                do {
                  bVar2 = *pbVar12;
                  *pbVar10 = bVar2;
                  pbVar10[-1] = bVar2;
                  pbVar10[-2] = bVar2;
                  pbVar12 = pbVar12 + 1;
                  uVar7 = uVar7 - 1;
                  pbVar10 = pbVar10 + 3;
                } while (0 < (int)uVar7);
              }
              break;
            case 0xc:
              if (-1 < iVar1) {
                lVar8 = 0;
                uVar7 = x;
                do {
                  uVar3 = data[lVar8 + uVar13];
                  puVar4[lVar8 * 4 + uVar14 + 2] = uVar3;
                  puVar4[lVar8 * 4 + uVar14 + 1] = uVar3;
                  puVar4[lVar8 * 4 + uVar14] = uVar3;
                  puVar4[lVar8 * 4 + uVar14 + 3] = 0xff;
                  uVar7 = uVar7 - 1;
                  lVar8 = lVar8 + 1;
                } while (0 < (int)uVar7);
              }
              break;
            default:
              goto switchD_0015c0e6_caseD_d;
            case 0x11:
              if (-1 < iVar1) {
                lVar8 = 0;
                uVar7 = x;
                do {
                  puVar4[lVar8 + uVar14] = data[lVar8 * 2 + uVar13];
                  uVar7 = uVar7 - 1;
                  lVar8 = lVar8 + 1;
                } while (0 < (int)uVar7);
              }
              break;
            case 0x13:
              if (-1 < iVar1) {
                pbVar10 = puVar4 + uVar14 + 2;
                uVar7 = x;
                do {
                  bVar2 = *pbVar12;
                  *pbVar10 = bVar2;
                  pbVar10[-1] = bVar2;
                  pbVar10[-2] = bVar2;
                  pbVar12 = pbVar12 + 2;
                  uVar7 = uVar7 - 1;
                  pbVar10 = pbVar10 + 3;
                } while (0 < (int)uVar7);
              }
              break;
            case 0x14:
              if (-1 < iVar1) {
                lVar8 = 0;
                uVar7 = x;
                do {
                  uVar3 = data[lVar8 + uVar13];
                  puVar4[lVar8 * 2 + uVar14 + 2] = uVar3;
                  puVar4[lVar8 * 2 + uVar14 + 1] = uVar3;
                  puVar4[lVar8 * 2 + uVar14] = uVar3;
                  puVar4[lVar8 * 2 + uVar14 + 3] = data[lVar8 + uVar13 + 1];
                  uVar7 = uVar7 - 1;
                  lVar8 = lVar8 + 2;
                } while (0 < (int)uVar7);
              }
              break;
            case 0x19:
              uVar7 = x;
              if (-1 < iVar1) {
                do {
                  bVar2 = pbVar12[2];
                  *pbVar10 = (byte)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                                    (uint)pbVar12[1] * 0x96 + (uint)*pbVar12 * 0x4d >> 8);
                  pbVar12 = pbVar12 + 3;
                  pbVar10 = pbVar10 + 1;
                  uVar7 = uVar7 - 1;
                } while (0 < (int)uVar7);
              }
              break;
            case 0x1a:
              uVar7 = x;
              if (-1 < iVar1) {
                do {
                  bVar2 = pbVar12[2];
                  *pbVar10 = (byte)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                                    (uint)pbVar12[1] * 0x96 + (uint)*pbVar12 * 0x4d >> 8);
                  pbVar10[1] = 0xff;
                  pbVar12 = pbVar12 + 3;
                  pbVar10 = pbVar10 + 2;
                  uVar7 = uVar7 - 1;
                } while (0 < (int)uVar7);
              }
              break;
            case 0x1c:
              uVar7 = x;
              if (-1 < iVar1) {
                do {
                  *pbVar10 = *pbVar12;
                  pbVar10[1] = pbVar12[1];
                  pbVar10[2] = pbVar12[2];
                  pbVar10[3] = 0xff;
                  pbVar12 = pbVar12 + 3;
                  pbVar10 = pbVar10 + 4;
                  uVar7 = uVar7 - 1;
                } while (0 < (int)uVar7);
              }
              break;
            case 0x21:
              if (-1 < iVar1) {
                lVar8 = 0;
                uVar7 = x;
                do {
                  bVar2 = data[lVar8 * 4 + uVar13 + 2];
                  puVar4[lVar8 + uVar14] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)data[lVar8 * 4 + uVar13 + 1] * 0x96 +
                               (uint)data[lVar8 * 4 + uVar13] * 0x4d >> 8);
                  uVar7 = uVar7 - 1;
                  lVar8 = lVar8 + 1;
                } while (0 < (int)uVar7);
              }
              break;
            case 0x22:
              if (-1 < iVar1) {
                lVar8 = 0;
                uVar7 = x;
                do {
                  bVar2 = data[lVar8 * 2 + uVar13 + 2];
                  puVar4[lVar8 + uVar14] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)data[lVar8 * 2 + uVar13 + 1] * 0x96 +
                               (uint)data[lVar8 * 2 + uVar13] * 0x4d >> 8);
                  puVar4[lVar8 + uVar14 + 1] = data[lVar8 * 2 + uVar13 + 3];
                  uVar7 = uVar7 - 1;
                  lVar8 = lVar8 + 2;
                } while (0 < (int)uVar7);
              }
            }
          }
          else {
switchD_0015c0e6_caseD_d:
            uVar7 = x;
            if (-1 < iVar1) {
              do {
                *pbVar10 = *pbVar12;
                pbVar10[1] = pbVar12[1];
                pbVar10[2] = pbVar12[2];
                pbVar12 = pbVar12 + 4;
                pbVar10 = pbVar10 + 3;
                uVar7 = uVar7 - 1;
              } while (0 < (int)uVar7);
            }
          }
          uVar11 = uVar11 + 1;
          uVar14 = (ulong)((int)uVar14 + x * req_comp);
          uVar13 = (ulong)((int)uVar13 + x * img_n);
        } while (uVar11 != uVar5);
      }
      free(data);
    }
  }
  return puVar4;
}

Assistant:

static unsigned char *convert_format(unsigned char *data, int img_n, int req_comp, uint x, uint y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   assert(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) malloc(req_comp * x * y);
   if (good == NULL) {
      free(data);
      return epuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define COMBO(a,b)  ((a)*8+(b))
      #define CASE(a,b)   case COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch(COMBO(img_n, req_comp)) {
         CASE(1,2) dest[0]=src[0], dest[1]=255; break;
         CASE(1,3) dest[0]=dest[1]=dest[2]=src[0]; break;
         CASE(1,4) dest[0]=dest[1]=dest[2]=src[0], dest[3]=255; break;
         CASE(2,1) dest[0]=src[0]; break;
         CASE(2,3) dest[0]=dest[1]=dest[2]=src[0]; break;
         CASE(2,4) dest[0]=dest[1]=dest[2]=src[0], dest[3]=src[1]; break;
         CASE(3,4) dest[0]=src[0],dest[1]=src[1],dest[2]=src[2],dest[3]=255; break;
         CASE(3,1) dest[0]=compute_y(src[0],src[1],src[2]); break;
         CASE(3,2) dest[0]=compute_y(src[0],src[1],src[2]), dest[1] = 255; break;
         CASE(4,1) dest[0]=compute_y(src[0],src[1],src[2]); break;
         CASE(4,2) dest[0]=compute_y(src[0],src[1],src[2]), dest[1] = src[3]; break;
         CASE(4,3) dest[0]=src[0],dest[1]=src[1],dest[2]=src[2]; break;
         default: assert(0);
      }
      #undef CASE
   }

   free(data);
   return good;
}